

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O0

bool __thiscall
CLParser::Parse(CLParser *this,string *output,string *deps_prefix,string *filtered_output,
               string *err)

{
  bool bVar1;
  Metrics *this_00;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  bool local_1a2;
  Metric *local_178;
  string local_148;
  _Base_ptr local_128;
  undefined1 local_120;
  string local_118;
  uint64_t local_f8;
  uint64_t slash_bits;
  string normalized;
  string include;
  string line;
  size_t end;
  ulong uStack_80;
  bool seen_show_includes;
  size_t start;
  ScopedMetric metrics_h_scoped;
  bool local_52;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  string *filtered_output_local;
  string *deps_prefix_local;
  string *output_local;
  CLParser *this_local;
  
  local_30 = err;
  err_local = filtered_output;
  filtered_output_local = deps_prefix;
  deps_prefix_local = output;
  output_local = (string *)this;
  if ((Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
       ::metrics_h_metric == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar3 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_52 = g_metrics == (Metrics *)0x0;
    if (local_52) {
      local_178 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"CLParser::Parse",&local_51);
      metrics_h_scoped.start_._3_1_ = 1;
      local_178 = Metrics::NewMetric(this_00,&local_50);
    }
    local_52 = !local_52;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (local_52) {
      std::allocator<char>::~allocator(&local_51);
    }
    Parse::metrics_h_metric = local_178;
    __cxa_guard_release(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&start,Parse::metrics_h_metric);
  if (deps_prefix_local != err_local) {
    uStack_80 = 0;
    bVar1 = false;
    while (uVar4 = std::__cxx11::string::size(), uStack_80 < uVar4) {
      line.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)deps_prefix_local,0x15ba53);
      if (line.field_2._8_8_ == -1) {
        line.field_2._8_8_ = std::__cxx11::string::size();
      }
      std::__cxx11::string::substr((ulong)((long)&include.field_2 + 8),(ulong)deps_prefix_local);
      FilterShowIncludes((string *)((long)&normalized.field_2 + 8),
                         (string *)((long)&include.field_2 + 8),filtered_output_local);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        bVar1 = true;
        std::__cxx11::string::string((string *)&slash_bits);
        std::__cxx11::string::operator=
                  ((string *)&slash_bits,(string *)(normalized.field_2._M_local_buf + 8));
        CanonicalizePath((string *)&slash_bits,&local_f8);
        std::__cxx11::string::string((string *)&local_118,(string *)&slash_bits);
        bVar2 = IsSystemInclude(&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&this->includes_,(value_type *)&slash_bits);
          local_128 = (_Base_ptr)pVar6.first._M_node;
          local_120 = pVar6.second;
        }
        std::__cxx11::string::~string((string *)&slash_bits);
      }
      else {
        local_1a2 = false;
        if (!bVar1) {
          std::__cxx11::string::string
                    ((string *)&local_148,(string *)(include.field_2._M_local_buf + 8));
          local_1a2 = FilterInputFilename(&local_148);
          std::__cxx11::string::~string((string *)&local_148);
        }
        if (local_1a2 == false) {
          std::__cxx11::string::append((string *)err_local);
          std::__cxx11::string::append((char *)err_local);
        }
      }
      uVar4 = std::__cxx11::string::size();
      if (((ulong)line.field_2._8_8_ < uVar4) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)deps_prefix_local),
         *pcVar5 == '\r')) {
        line.field_2._8_8_ = line.field_2._8_8_ + 1;
      }
      uVar4 = std::__cxx11::string::size();
      if (((ulong)line.field_2._8_8_ < uVar4) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)deps_prefix_local),
         *pcVar5 == '\n')) {
        line.field_2._8_8_ = line.field_2._8_8_ + 1;
      }
      uStack_80 = line.field_2._8_8_;
      std::__cxx11::string::~string((string *)(normalized.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(include.field_2._M_local_buf + 8));
    }
    ScopedMetric::~ScopedMetric((ScopedMetric *)&start);
    return true;
  }
  __assert_fail("&output != filtered_output",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clparser.cc",
                0x55,"bool CLParser::Parse(const string &, const string &, string *, string *)");
}

Assistant:

bool CLParser::Parse(const string& output, const string& deps_prefix,
                     string* filtered_output, string* err) {
  METRIC_RECORD("CLParser::Parse");

  // Loop over all lines in the output to process them.
  assert(&output != filtered_output);
  size_t start = 0;
  bool seen_show_includes = false;
#ifdef _WIN32
  IncludesNormalize normalizer(".");
#endif

  while (start < output.size()) {
    size_t end = output.find_first_of("\r\n", start);
    if (end == string::npos)
      end = output.size();
    string line = output.substr(start, end - start);

    string include = FilterShowIncludes(line, deps_prefix);
    if (!include.empty()) {
      seen_show_includes = true;
      string normalized;
#ifdef _WIN32
      if (!normalizer.Normalize(include, &normalized, err))
        return false;
#else
      // TODO: should this make the path relative to cwd?
      normalized = include;
      uint64_t slash_bits;
      CanonicalizePath(&normalized, &slash_bits);
#endif
      if (!IsSystemInclude(normalized))
        includes_.insert(normalized);
    } else if (!seen_show_includes && FilterInputFilename(line)) {
      // Drop it.
      // TODO: if we support compiling multiple output files in a single
      // cl.exe invocation, we should stash the filename.
    } else {
      filtered_output->append(line);
      filtered_output->append("\n");
    }

    if (end < output.size() && output[end] == '\r')
      ++end;
    if (end < output.size() && output[end] == '\n')
      ++end;
    start = end;
  }

  return true;
}